

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O2

void make_pred(update_data_conflict *data,float x,float *wref)

{
  uint uVar1;
  OjaNewton *pOVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  
  pOVar2 = data->ON;
  uVar1 = pOVar2->m;
  if (pOVar2->normalize == true) {
    fVar5 = wref[(long)(int)uVar1 + 1];
    if (fVar5 < 0.0) {
      fVar5 = sqrtf(fVar5);
    }
    else {
      fVar5 = SQRT(fVar5);
    }
    x = x / fVar5;
    pOVar2 = data->ON;
  }
  fVar5 = *wref * x + data->prediction;
  data->prediction = fVar5;
  uVar3 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    fVar5 = fVar5 + wref[uVar3 + 1] * x * pOVar2->D[uVar3 + 1] * pOVar2->b[uVar3 + 1];
    data->prediction = fVar5;
  }
  return;
}

Assistant:

void make_pred(update_data& data, float x, float& wref)
{
  int m = data.ON->m;
  float* w = &wref;

  if (data.ON->normalize)
  {
    x /= sqrt(w[NORM2]);
  }

  data.prediction += w[0] * x;
  for (int i = 1; i <= m; i++)
  {
    data.prediction += w[i] * x * data.ON->D[i] * data.ON->b[i];
  }
}